

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O2

void __thiscall
Path::stroke(Path *this,vector<Shape,_std::allocator<Shape>_> *shapes,float width,
            shared_ptr<Paint> *paint)

{
  pointer pSVar1;
  Point *p1;
  pointer pPVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  vector<Point,_std::allocator<Point>_> *points;
  pointer pSVar6;
  Shape *shape;
  float offset;
  Subpath new_subpath;
  Subpath local_58;
  
  std::vector<Shape,std::allocator<Shape>>::emplace_back<std::shared_ptr<Paint>const&>
            ((vector<Shape,std::allocator<Shape>> *)shapes,paint);
  offset = width * 0.5;
  shape = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
          super__Vector_impl_data._M_finish + -1;
  pSVar1 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar6 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar6 != pSVar1; pSVar6 = pSVar6 + 1) {
    new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    new_subpath._17_8_ = 0;
    new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    lVar4 = 8;
    uVar3 = 1;
    while( true ) {
      p1 = (pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
           super__Vector_impl_data._M_start;
      pPVar2 = (pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar5 = (long)pPVar2 - (long)p1 >> 3;
      if (uVar5 <= uVar3) break;
      Subpath::push_offset_segment
                (&new_subpath,(Point *)((long)&p1[-1].x + lVar4),(Point *)((long)&p1->x + lVar4),
                 offset);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 8;
    }
    if (pSVar6->closed != false) {
      Subpath::push_offset_segment(&new_subpath,pPVar2 + -1,p1,offset);
      new_subpath.closed = true;
      fill_subpath(this,&new_subpath,shape);
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.closed = false;
      local_58._25_7_ = 0;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Subpath::operator=(&new_subpath,&local_58);
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                ((_Vector_base<Point,_std::allocator<Point>_> *)&local_58);
      Subpath::push_offset_segment
                (&new_subpath,
                 (pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1,offset);
      uVar5 = (long)(pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
    }
    lVar4 = uVar5 * 8 + -0x10;
    while (uVar5 = uVar5 - 1, uVar5 != 0) {
      pPVar2 = (pSVar6->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      Subpath::push_offset_segment
                (&new_subpath,(Point *)((long)&pPVar2[1].x + lVar4),
                 (Point *)((long)&pPVar2->x + lVar4),offset);
      lVar4 = lVar4 + -8;
    }
    new_subpath.closed = true;
    fill_subpath(this,&new_subpath,shape);
    std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
              ((_Vector_base<Point,_std::allocator<Point>_> *)&new_subpath);
  }
  return;
}

Assistant:

void stroke(std::vector<Shape>& shapes, float width, const std::shared_ptr<Paint>& paint) const {
		shapes.emplace_back(paint);
		Shape& shape = shapes.back();
		const float offset = width / 2.f;
		for (const Subpath& subpath: subpaths) {
			const std::vector<Point>& points = subpath.points;
			Subpath new_subpath;
			for (size_t i = 1; i < points.size(); ++i) {
				new_subpath.push_offset_segment(points[i-1], points[i], offset);
			}
			if (subpath.closed) {
				new_subpath.push_offset_segment(points.back(), points.front(), offset);
				new_subpath.closed = true;
				fill_subpath(new_subpath, shape);
				new_subpath = Subpath();
				new_subpath.push_offset_segment(points.front(), points.back(), offset);
			}
			for (size_t i = points.size() - 1; i > 0; --i) {
				new_subpath.push_offset_segment(points[i], points[i-1], offset);
			}
			new_subpath.closed = true;
			fill_subpath(new_subpath, shape);
		}
	}